

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O2

void * __thiscall cnn::CPUAllocator::malloc(CPUAllocator *this,size_t __size)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  out_of_memory *this_00;
  ulong __alignment;
  allocator local_39;
  string local_38;
  
  uVar2 = (ulong)(this->super_MemAllocator).align;
  if (uVar2 == 1) {
    local_38._M_dataplus._M_p = (pointer)::malloc(__size);
  }
  else {
    __alignment = 8;
    if (8 < uVar2) {
      __alignment = uVar2;
    }
    if ((uVar2 & uVar2 - 1) != 0) {
      __alignment = uVar2;
    }
    iVar1 = posix_memalign((void **)&local_38,__alignment,__size);
    if (iVar1 != 0) goto LAB_00261e66;
  }
  if (local_38._M_dataplus._M_p != (pointer)0x0) {
    return local_38._M_dataplus._M_p;
  }
LAB_00261e66:
  poVar3 = std::operator<<((ostream *)&std::cerr,"CPU memory allocation failed n=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," align=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->super_MemAllocator).align);
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (out_of_memory *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_38,"CPU memory allocation failed",&local_39);
  out_of_memory::out_of_memory(this_00,&local_38);
  __cxa_throw(this_00,&out_of_memory::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void* CPUAllocator::malloc(size_t n) {
  void* ptr = _mm_malloc(n, align);
  if (!ptr) {
    cerr << "CPU memory allocation failed n=" << n << " align=" << align << endl;
    throw cnn::out_of_memory("CPU memory allocation failed");
  }
  return ptr;
}